

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionBody::CanFunctionObjectHaveInlineCaches(FunctionBody *this)

{
  uint sourceContextId;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  uint uVar8;
  
  if (((this->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None) {
    pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_0076d2de;
      *puVar6 = 0;
      pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar7->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) goto LAB_0076d2de;
      *puVar6 = 0;
      pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((pFVar7->attributes & (Async|Generator)) == None) {
      uVar3 = GetCountField(this,InlineCacheCount);
      uVar4 = GetCountField(this,IsInstInlineCacheCount);
      pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      sourceContextId =
           ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
      if (pFVar7 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) {
LAB_0076d2de:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
        pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01599240,ScriptFunctionWithInlineCachePhase,
                                sourceContextId,pFVar7->functionId);
      if ((uVar4 + uVar3 != 0) && (bVar2)) {
        return true;
      }
      uVar8 = DAT_0159f008 + DAT_0159eff4;
      if ((-1 < (int)uVar8) && (uVar5 = GetCountField(this,ByteCodeWithoutLDACount), uVar5 <= uVar8)
         ) {
        return (uVar4 + uVar3) - 1 < DAT_015a4e78 && -1 < (int)DAT_015a4e78;
      }
    }
  }
  return false;
}

Assistant:

bool FunctionBody::CanFunctionObjectHaveInlineCaches()
    {
        if (this->DoStackNestedFunc() || this->IsCoroutine())
        {
            return false;
        }

        uint totalCacheCount = this->GetInlineCacheCount() + this->GetIsInstInlineCacheCount();
        if (PHASE_FORCE(Js::ScriptFunctionWithInlineCachePhase, this) && totalCacheCount > 0)
        {
            return true;
        }

        // Only have inline caches on function object for possible inlining candidates.
        // Since we don't know the size of the top function, check against the maximum possible inline threshold
        // Negative inline byte code size threshold will disable inline cache on function object.
        const int byteCodeSizeThreshold = CONFIG_FLAG(InlineThreshold) + CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
        if (byteCodeSizeThreshold < 0 || this->GetByteCodeWithoutLDACount() > (uint)byteCodeSizeThreshold)
        {
            return false;
        }
        // Negative FuncObjectInlineCacheThreshold will disable inline cache on function object.
        if (CONFIG_FLAG(FuncObjectInlineCacheThreshold) < 0 || totalCacheCount > (uint)CONFIG_FLAG(FuncObjectInlineCacheThreshold) || totalCacheCount == 0)
        {
            return false;
        }

        return true;
    }